

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

void __thiscall
SBarInfoCommand::GetCoordinates
          (SBarInfoCommand *this,FScanner *sc,bool fullScreenOffsets,SBarInfoCoordinate *x,
          SBarInfoCoordinate *y)

{
  bool bVar1;
  int local_5c;
  int local_4c;
  SBarInfoCoordinate *pSStack_48;
  int i;
  SBarInfoCoordinate *coords [2];
  bool relCenter;
  bool negative;
  SBarInfoCoordinate *y_local;
  SBarInfoCoordinate *x_local;
  bool fullScreenOffsets_local;
  FScanner *sc_local;
  SBarInfoCommand *this_local;
  
  pSStack_48 = x;
  coords[0] = y;
  for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
    coords[1]._7_1_ = 0;
    coords[1]._6_1_ = 0;
    if (0 < local_4c) {
      FScanner::MustGetToken(sc,0x2c);
    }
    coords[1]._7_1_ = FScanner::CheckToken(sc,0x2d);
    FScanner::MustGetToken(sc,0x104);
    if ((coords[1]._7_1_ & 1) == 0) {
      local_5c = sc->Number;
    }
    else {
      local_5c = -sc->Number;
    }
    SBarInfoCoordinate::Set
              (*(SBarInfoCoordinate **)((long)&stack0xffffffffffffffb8 + (long)local_4c * 8),
               local_5c,false);
    bVar1 = FScanner::CheckToken(sc,0x2b);
    if (bVar1) {
      FScanner::MustGetToken(sc,0x101);
      bVar1 = FScanner::Compare(sc,"center");
      if (!bVar1) {
        FScanner::ScriptError(sc,"Expected \'center\' but got \'%s\' instead.",sc->String);
      }
      coords[1]._6_1_ = 1;
    }
    if (fullScreenOffsets) {
      SBarInfoCoordinate::SetRelCenter
                (*(SBarInfoCoordinate **)((long)&stack0xffffffffffffffb8 + (long)local_4c * 8),
                 (bool)(coords[1]._6_1_ & 1));
    }
  }
  return;
}

Assistant:

void		GetCoordinates(FScanner &sc, bool fullScreenOffsets, SBarInfoCoordinate &x, SBarInfoCoordinate &y)
		{
			bool negative = false;
			bool relCenter = false;
			SBarInfoCoordinate *coords[2] = {&x, &y};
			for(int i = 0;i < 2;i++)
			{
				negative = false;
				relCenter = false;
				if(i > 0)
					sc.MustGetToken(',');
			
				// [-]INT center
				negative = sc.CheckToken('-');
				sc.MustGetToken(TK_IntConst);
				coords[i]->Set(negative ? -sc.Number : sc.Number, false);
				if(sc.CheckToken('+'))
				{
					sc.MustGetToken(TK_Identifier);
					if(!sc.Compare("center"))
						sc.ScriptError("Expected 'center' but got '%s' instead.", sc.String);
					relCenter = true;
				}
				if(fullScreenOffsets)
				{
					coords[i]->SetRelCenter(relCenter);
				}
			}

			//if(!fullScreenOffsets)
			//	y.SetCoord((negative ? -sc.Number : sc.Number) - (200 - script->height));
		}